

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O3

int lheader(lua_State *L)

{
  size_t in_RAX;
  char *pcVar1;
  size_t sVar2;
  ulong n;
  size_t len;
  size_t local_18;
  
  local_18 = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&local_18);
  if (local_18 - 5 < 0xfffffffffffffffc) {
    luaL_error(L,"Invalid read %s",pcVar1);
  }
  sVar2 = 0;
  n = 0;
  do {
    n = (ulong)(byte)pcVar1[sVar2] | n << 8;
    sVar2 = sVar2 + 1;
  } while (local_18 != sVar2);
  lua_pushinteger(L,n);
  return 1;
}

Assistant:

static int
lheader(lua_State *L) {
	size_t len;
	const uint8_t * s = (const uint8_t *)luaL_checklstring(L, 1, &len);
	if (len > 4 || len < 1) {
		return luaL_error(L, "Invalid read %s", s);
	}
	int i;
	size_t sz = 0;
	for (i=0;i<(int)len;i++) {
		sz <<= 8;
		sz |= s[i];
	}

	lua_pushinteger(L, (lua_Integer)sz);

	return 1;
}